

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_noCopierForCustomTypeOutputParameter_Test::
TEST_MockComparatorCopierTest_noCopierForCustomTypeOutputParameter_Test
          (TEST_MockComparatorCopierTest_noCopierForCustomTypeOutputParameter_Test *this)

{
  TEST_MockComparatorCopierTest_noCopierForCustomTypeOutputParameter_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockComparatorCopierTest::TEST_GROUP_CppUTestGroupMockComparatorCopierTest
            (&this->super_TEST_GROUP_CppUTestGroupMockComparatorCopierTest);
  (this->super_TEST_GROUP_CppUTestGroupMockComparatorCopierTest).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_MockComparatorCopierTest_noCopierForCustomTypeOutputParameter_Test_003319a0;
  return;
}

Assistant:

TEST(MockComparatorCopierTest, noCopierForCustomTypeOutputParameter)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting expectedObject(123464);
    MyTypeForTesting actualObject(8834);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    MockNoWayToCopyCustomTypeFailure expectedFailure(mockFailureTest(), "MyTypeForTesting");

    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "output", &expectedObject);
    mock().actualCall("foo").withOutputParameterOfType("MyTypeForTesting", "output", &actualObject);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}